

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O2

void __thiscall helics::apps::AsioBrokerServer::mainLoop(AsioBrokerServer *this)

{
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  undefined1 local_88 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  code *local_28;
  code *local_20;
  
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = (element_type *)0x0;
  local_88[0x10] = '\0';
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)(local_88 + 0x20),(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  if (this->tcp_enabled_ == true) {
    loadTCPserver((AsioBrokerServer *)local_88,(io_context *)this);
    std::__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->tcpserver).
                super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:284:17)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:284:17)>
               ::_M_manager;
    local_38._M_allocated_capacity = (size_type)this;
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=(&((this->tcpserver).
                  super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->dataCall,
                (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)&local_38);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_38);
    loadTCPServerData(&this->tcpPortData);
    gmlc::networking::TcpServer::start
              ((this->tcpserver).
               super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (this->udp_enabled_ == true) {
    loadUDPserver((AsioBrokerServer *)local_88,(io_context *)this);
    std::__shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->udpserver).
                super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = std::
               _Function_handler<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:297:17)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:297:17)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    std::function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>::
    operator=(&((this->udpserver).
                super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mDataCall,
              (function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
               *)&local_58);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_58);
    loadUDPServerData(&this->udpPortData);
    udp::UdpServer::start_receive
              ((this->udpserver).
               super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  return;
}

Assistant:

void AsioBrokerServer::mainLoop()
    {
#if defined(HELICS_ENABLE_TCP_CORE) || defined(HELICS_ENABLE_UDP_CORE)
        auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
#endif

#ifdef HELICS_ENABLE_TCP_CORE
        if (tcp_enabled_) {
            tcpserver = loadTCPserver(ioctx->getBaseContext());
            tcpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](gmlc::networking::TcpConnection::pointer connection,
                       const char* data,
                       size_t datasize) { return tcpDataReceive(connection, data, datasize); });

            loadTCPServerData(tcpPortData);
            tcpserver->start();
        }
#endif
#ifdef HELICS_ENABLE_UDP_CORE
        if (udp_enabled_) {
            udpserver = loadUDPserver(ioctx->getBaseContext());
            udpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](std::shared_ptr<udp::UdpServer> server, const char* data, size_t datasize) {
                    return udpDataReceive(server, data, datasize);
                });

            loadUDPServerData(udpPortData);
            udpserver->start_receive();
        }
#endif
    }